

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

ENetPeer *
enet_protocol_handle_connect(ENetHost *host,ENetProtocolHeader *header,ENetProtocol *command)

{
  enet_uint8 eVar1;
  uint uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  void *pvVar5;
  ENetProtocolHeader local_a0;
  ENetProtocolHeader local_9c;
  undefined1 local_90 [8];
  ENetProtocol verifyCommand;
  ENetPeer *peer;
  ENetPeer *currentPeer;
  size_t duplicatePeers;
  size_t channelCount;
  ENetChannel *channel;
  uint32_t local_30;
  enet_uint32 windowSize;
  enet_uint32 mtu;
  enet_uint8 outgoingSessionID;
  enet_uint8 incomingSessionID;
  ENetProtocol *command_local;
  ENetProtocolHeader *header_local;
  ENetHost *host_local;
  
  currentPeer = (ENetPeer *)0x0;
  verifyCommand._40_8_ = 0;
  _mtu = command;
  command_local = (ENetProtocol *)header;
  header_local = (ENetProtocolHeader *)host;
  uVar4 = ntohl((command->connect).channelCount);
  duplicatePeers = (size_t)uVar4;
  if ((duplicatePeers == 0) || (0xff < duplicatePeers)) {
    host_local = (ENetHost *)0x0;
  }
  else {
    for (peer = *(ENetPeer **)(header_local + 10);
        peer < (ENetPeer *)(*(long *)(header_local + 10) + *(long *)(header_local + 0xc) * 0x1c8);
        peer = peer + 1) {
      if (peer->state == ENET_PEER_STATE_DISCONNECTED) {
        if (verifyCommand._40_8_ == 0) {
          verifyCommand._40_8_ = peer;
        }
      }
      else if ((peer->state != ENET_PEER_STATE_CONNECTING) &&
              ((ENetProtocolHeader)(peer->address).host == header_local[0xaae])) {
        if (((peer->address).port == header_local[0xaaf].peerID) &&
           (peer->connectID == (_mtu->connect).connectID)) {
          return (ENetPeer *)0x0;
        }
        currentPeer = (ENetPeer *)((long)&(currentPeer->dispatchList).next + 1);
      }
    }
    if ((verifyCommand._40_8_ == 0) || (*(ENetPeer **)(header_local + 0xabe) <= currentPeer)) {
      host_local = (ENetHost *)0x0;
    }
    else {
      if (*(ulong *)(header_local + 0xe) < duplicatePeers) {
        duplicatePeers = *(size_t *)(header_local + 0xe);
      }
      pvVar5 = enet_malloc(duplicatePeers * 0x50);
      *(void **)(verifyCommand._40_8_ + 0x40) = pvVar5;
      if (*(long *)(verifyCommand._40_8_ + 0x40) == 0) {
        host_local = (ENetHost *)0x0;
      }
      else {
        *(size_t *)(verifyCommand._40_8_ + 0x48) = duplicatePeers;
        *(undefined4 *)(verifyCommand._40_8_ + 0x38) = 2;
        *(enet_uint32 *)(verifyCommand._40_8_ + 0x1c) = (_mtu->connect).connectID;
        *(undefined8 *)(verifyCommand._40_8_ + 0x24) = *(undefined8 *)(header_local + 0xaae);
        uVar3 = ntohs((_mtu->acknowledge).receivedReliableSequenceNumber);
        *(uint16_t *)(verifyCommand._40_8_ + 0x18) = uVar3;
        uVar4 = ntohl((_mtu->connect).incomingBandwidth);
        *(uint32_t *)(verifyCommand._40_8_ + 0x50) = uVar4;
        uVar4 = ntohl((_mtu->connect).outgoingBandwidth);
        *(uint32_t *)(verifyCommand._40_8_ + 0x54) = uVar4;
        uVar4 = ntohl((_mtu->connect).packetThrottleInterval);
        *(uint32_t *)(verifyCommand._40_8_ + 0xa4) = uVar4;
        uVar4 = ntohl((_mtu->connect).packetThrottleAcceleration);
        *(uint32_t *)(verifyCommand._40_8_ + 0x9c) = uVar4;
        uVar4 = ntohl((_mtu->connect).packetThrottleDeceleration);
        *(uint32_t *)(verifyCommand._40_8_ + 0xa0) = uVar4;
        uVar4 = ntohl((_mtu->connect).data);
        *(uint32_t *)(verifyCommand._40_8_ + 0x1b8) = uVar4;
        if ((_mtu->connect).incomingSessionID == 0xff) {
          eVar1 = *(enet_uint8 *)(verifyCommand._40_8_ + 0x20);
        }
        else {
          eVar1 = (_mtu->connect).incomingSessionID;
        }
        windowSize._3_1_ = eVar1 + 1 & 3;
        if (windowSize._3_1_ == *(byte *)(verifyCommand._40_8_ + 0x20)) {
          windowSize._3_1_ = windowSize._3_1_ + 1 & 3;
        }
        *(byte *)(verifyCommand._40_8_ + 0x20) = windowSize._3_1_;
        if ((_mtu->connect).outgoingSessionID == 0xff) {
          eVar1 = *(enet_uint8 *)(verifyCommand._40_8_ + 0x21);
        }
        else {
          eVar1 = (_mtu->connect).outgoingSessionID;
        }
        windowSize._2_1_ = eVar1 + 1 & 3;
        if (windowSize._2_1_ == *(byte *)(verifyCommand._40_8_ + 0x21)) {
          windowSize._2_1_ = windowSize._2_1_ + 1 & 3;
        }
        *(byte *)(verifyCommand._40_8_ + 0x21) = windowSize._2_1_;
        for (channelCount = *(size_t *)(verifyCommand._40_8_ + 0x40);
            channelCount < *(long *)(verifyCommand._40_8_ + 0x40) + duplicatePeers * 0x50;
            channelCount = channelCount + 0x50) {
          *(undefined2 *)channelCount = 0;
          *(undefined2 *)(channelCount + 2) = 0;
          *(undefined2 *)(channelCount + 0x26) = 0;
          *(undefined2 *)(channelCount + 0x28) = 0;
          enet_list_clear((ENetList *)(channelCount + 0x30));
          enet_list_clear((ENetList *)(channelCount + 0x40));
          *(undefined2 *)(channelCount + 4) = 0;
          memset((void *)(channelCount + 6),0,0x20);
        }
        local_30 = ntohl((_mtu->connect).mtu);
        if (local_30 < 0x240) {
          local_30 = 0x240;
        }
        else if (0x1000 < local_30) {
          local_30 = 0x1000;
        }
        *(uint32_t *)(verifyCommand._40_8_ + 0xd0) = local_30;
        if ((header_local[4] == (ENetProtocolHeader)0x0) &&
           (*(int *)(verifyCommand._40_8_ + 0x50) == 0)) {
          *(undefined4 *)(verifyCommand._40_8_ + 0xd4) = 0x10000;
        }
        else if ((header_local[4] == (ENetProtocolHeader)0x0) ||
                (*(int *)(verifyCommand._40_8_ + 0x50) == 0)) {
          if ((uint)*(ENetProtocolHeader *)(verifyCommand._40_8_ + 0x50) < (uint)header_local[4]) {
            local_9c = header_local[4];
          }
          else {
            local_9c = *(ENetProtocolHeader *)(verifyCommand._40_8_ + 0x50);
          }
          *(uint *)(verifyCommand._40_8_ + 0xd4) = ((uint)local_9c >> 0x10) << 0xc;
        }
        else {
          if ((uint)header_local[4] < (uint)*(ENetProtocolHeader *)(verifyCommand._40_8_ + 0x50)) {
            local_a0 = header_local[4];
          }
          else {
            local_a0 = *(ENetProtocolHeader *)(verifyCommand._40_8_ + 0x50);
          }
          *(uint *)(verifyCommand._40_8_ + 0xd4) = ((uint)local_a0 >> 0x10) << 0xc;
        }
        if (*(uint *)(verifyCommand._40_8_ + 0xd4) < 0x1000) {
          *(undefined4 *)(verifyCommand._40_8_ + 0xd4) = 0x1000;
        }
        else if (0x10000 < *(uint *)(verifyCommand._40_8_ + 0xd4)) {
          *(undefined4 *)(verifyCommand._40_8_ + 0xd4) = 0x10000;
        }
        if (header_local[3] == (ENetProtocolHeader)0x0) {
          channel._4_4_ = 0x10000;
        }
        else {
          channel._4_4_ = ((uint)header_local[3] >> 0x10) << 0xc;
        }
        uVar2 = channel._4_4_;
        uVar4 = ntohl((_mtu->connect).windowSize);
        if (uVar4 < uVar2) {
          channel._4_4_ = ntohl((_mtu->connect).windowSize);
        }
        if (channel._4_4_ < 0x1000) {
          channel._4_4_ = 0x1000;
        }
        else if (0x10000 < channel._4_4_) {
          channel._4_4_ = 0x10000;
        }
        local_90[0] = 0x83;
        local_90[1] = 0xff;
        local_90._4_2_ = htons(*(uint16_t *)(verifyCommand._40_8_ + 0x1a));
        local_90[6] = windowSize._3_1_;
        local_90[7] = windowSize._2_1_;
        verifyCommand.header =
             (ENetProtocolCommandHeader)htonl(*(uint32_t *)(verifyCommand._40_8_ + 0xd0));
        verifyCommand.disconnect.data = htonl(channel._4_4_);
        verifyCommand.connect.mtu = htonl((uint32_t)duplicatePeers);
        verifyCommand.connect.windowSize = htonl((uint32_t)header_local[3]);
        verifyCommand.connect.channelCount = htonl((uint32_t)header_local[4]);
        verifyCommand.connect.incomingBandwidth = htonl(*(uint32_t *)(verifyCommand._40_8_ + 0xa4));
        verifyCommand.connect.outgoingBandwidth = htonl(*(uint32_t *)(verifyCommand._40_8_ + 0x9c));
        verifyCommand.connect.packetThrottleInterval =
             htonl(*(uint32_t *)(verifyCommand._40_8_ + 0xa0));
        verifyCommand.connect.packetThrottleAcceleration =
             *(enet_uint32 *)(verifyCommand._40_8_ + 0x1c);
        enet_peer_queue_outgoing_command
                  ((ENetPeer *)verifyCommand._40_8_,(ENetProtocol *)local_90,(ENetPacket *)0x0,0,0);
        host_local = (ENetHost *)verifyCommand._40_8_;
      }
    }
  }
  return (ENetPeer *)host_local;
}

Assistant:

static ENetPeer *
enet_protocol_handle_connect (ENetHost * host, ENetProtocolHeader * header, ENetProtocol * command)
{
    enet_uint8 incomingSessionID, outgoingSessionID;
    enet_uint32 mtu, windowSize;
    ENetChannel * channel;
    size_t channelCount, duplicatePeers = 0;
    ENetPeer * currentPeer, * peer = NULL;
    ENetProtocol verifyCommand;

    channelCount = ENET_NET_TO_HOST_32 (command -> connect.channelCount);

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT ||
        channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      return NULL;

    for (currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
        {
            if (peer == NULL)
              peer = currentPeer;
        }
        else 
        if (currentPeer -> state != ENET_PEER_STATE_CONNECTING &&
            currentPeer -> address.host == host -> receivedAddress.host)
        {
            if (currentPeer -> address.port == host -> receivedAddress.port &&
                currentPeer -> connectID == command -> connect.connectID)
              return NULL;

            ++ duplicatePeers;
        }
    }

    if (peer == NULL || duplicatePeers >= host -> duplicatePeers)
      return NULL;

    if (channelCount > host -> channelLimit)
      channelCount = host -> channelLimit;
    peer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (peer -> channels == NULL)
      return NULL;
    peer -> channelCount = channelCount;
    peer -> state = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
    peer -> connectID = command -> connect.connectID;
    peer -> address = host -> receivedAddress;
    peer -> outgoingPeerID = ENET_NET_TO_HOST_16 (command -> connect.outgoingPeerID);
    peer -> incomingBandwidth = ENET_NET_TO_HOST_32 (command -> connect.incomingBandwidth);
    peer -> outgoingBandwidth = ENET_NET_TO_HOST_32 (command -> connect.outgoingBandwidth);
    peer -> packetThrottleInterval = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleInterval);
    peer -> packetThrottleAcceleration = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleAcceleration);
    peer -> packetThrottleDeceleration = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleDeceleration);
    peer -> eventData = ENET_NET_TO_HOST_32 (command -> connect.data);

    incomingSessionID = command -> connect.incomingSessionID == 0xFF ? peer -> outgoingSessionID : command -> connect.incomingSessionID;
    incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    if (incomingSessionID == peer -> outgoingSessionID)
      incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    peer -> outgoingSessionID = incomingSessionID;

    outgoingSessionID = command -> connect.outgoingSessionID == 0xFF ? peer -> incomingSessionID : command -> connect.outgoingSessionID;
    outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    if (outgoingSessionID == peer -> incomingSessionID)
      outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    peer -> incomingSessionID = outgoingSessionID;

    for (channel = peer -> channels;
         channel < & peer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }

    mtu = ENET_NET_TO_HOST_32 (command -> connect.mtu);

    if (mtu < ENET_PROTOCOL_MINIMUM_MTU)
      mtu = ENET_PROTOCOL_MINIMUM_MTU;
    else
    if (mtu > ENET_PROTOCOL_MAXIMUM_MTU)
      mtu = ENET_PROTOCOL_MAXIMUM_MTU;

    peer -> mtu = mtu;

    if (host -> outgoingBandwidth == 0 &&
        peer -> incomingBandwidth == 0)
      peer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
    if (host -> outgoingBandwidth == 0 ||
        peer -> incomingBandwidth == 0)
      peer -> windowSize = (ENET_MAX (host -> outgoingBandwidth, peer -> incomingBandwidth) /
                                    ENET_PEER_WINDOW_SIZE_SCALE) *
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
      peer -> windowSize = (ENET_MIN (host -> outgoingBandwidth, peer -> incomingBandwidth) /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (peer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      peer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (peer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      peer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

    if (host -> incomingBandwidth == 0)
      windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      windowSize = (host -> incomingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) *
                     ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (windowSize > ENET_NET_TO_HOST_32 (command -> connect.windowSize))
      windowSize = ENET_NET_TO_HOST_32 (command -> connect.windowSize);

    if (windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

    verifyCommand.header.command = ENET_PROTOCOL_COMMAND_VERIFY_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    verifyCommand.header.channelID = 0xFF;
    verifyCommand.verifyConnect.outgoingPeerID = ENET_HOST_TO_NET_16 (peer -> incomingPeerID);
    verifyCommand.verifyConnect.incomingSessionID = incomingSessionID;
    verifyCommand.verifyConnect.outgoingSessionID = outgoingSessionID;
    verifyCommand.verifyConnect.mtu = ENET_HOST_TO_NET_32 (peer -> mtu);
    verifyCommand.verifyConnect.windowSize = ENET_HOST_TO_NET_32 (windowSize);
    verifyCommand.verifyConnect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    verifyCommand.verifyConnect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    verifyCommand.verifyConnect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    verifyCommand.verifyConnect.packetThrottleInterval = ENET_HOST_TO_NET_32 (peer -> packetThrottleInterval);
    verifyCommand.verifyConnect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (peer -> packetThrottleAcceleration);
    verifyCommand.verifyConnect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (peer -> packetThrottleDeceleration);
    verifyCommand.verifyConnect.connectID = peer -> connectID;

    enet_peer_queue_outgoing_command (peer, & verifyCommand, NULL, 0, 0);

    return peer;
}